

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::find(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  bool bVar1;
  SparseArray<re2::NFA::Thread_*> *pSVar2;
  
  bVar1 = has_index(this,i);
  pSVar2 = (SparseArray<re2::NFA::Thread_*> *)(this->sparse_to_dense_ + i);
  if (!bVar1) {
    pSVar2 = this;
  }
  return (iterator)
         ((this->dense_).
          super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
          ._M_impl.super__Vector_impl_data._M_start + pSVar2->size_);
}

Assistant:

typename SparseArray<Value>::iterator SparseArray<Value>::find(int i) {
  if (has_index(i))
    return dense_.begin() + sparse_to_dense_[i];
  return end();
}